

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall CLParam<int>::PrintSimple(CLParam<int> *this)

{
  ostream *this_00;
  long *plVar1;
  
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,*(char **)(this + 8),*(long *)(this + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  plVar1 = (long *)std::ostream::operator<<(this_00,*(int *)(this + 0x50));
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintSimple()
    {
        std::cout << parameter_name << " " << value << std::endl ;
    }